

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq2_s(block_iq2_s *x,float *y,int64_t k)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  uint8_t *puVar7;
  long lVar8;
  long lVar9;
  int l;
  ulong uVar10;
  uint8_t *puVar11;
  long lVar12;
  float fVar13;
  undefined8 local_38;
  
  lVar8 = 0;
  lVar6 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar6 = lVar8;
  }
  for (; lVar8 != lVar6; lVar8 = lVar8 + 1) {
    puVar7 = x[lVar8].qs;
    puVar11 = x[lVar8].qs + 0x20;
    fVar1 = ggml_table_f32_f16[x[lVar8].d];
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      local_38 = CONCAT44(((float)(x[lVar8].scales[lVar12] >> 4) + 0.5) * fVar1 * 0.25,
                          ((float)(x[lVar8].scales[lVar12] & 0xf) + 0.5) * fVar1 * 0.25);
      bVar3 = x[lVar8].qh[lVar12];
      for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
        fVar2 = *(float *)((long)&local_38 + (uVar10 >> 1 & 0x7fffffff) * 4);
        bVar4 = puVar7[uVar10];
        bVar5 = puVar11[uVar10];
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          fVar13 = (float)*(byte *)((long)iq2s_grid +
                                   lVar9 + (ulong)(((uint)bVar3 << ((char)uVar10 * -2 + 8U & 0x1f) &
                                                    0x300 | (uint)bVar4) << 3)) * fVar2;
          if ((kmask_iq2xs[lVar9] & bVar5) != 0) {
            fVar13 = -fVar13;
          }
          y[lVar9] = fVar13;
        }
        y = y + 8;
      }
      puVar7 = puVar7 + 4;
      puVar11 = puVar11 + 4;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq2_s(const block_iq2_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float db[2];

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = qs + QK_K/8;

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            db[0] = d * (0.5f + (x[i].scales[ib32] & 0xf)) * 0.25f;
            db[1] = d * (0.5f + (x[i].scales[ib32] >>  4)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const float dl = db[l/2];
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 4;
            signs += 4;
        }
    }
}